

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O3

int os_interface_linux_state_set(os_interface *os_if,_Bool up)

{
  ushort uVar1;
  oonf_log_source oVar2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  ushort uVar6;
  char *src;
  int iVar7;
  char *pcVar8;
  ifreq ifr;
  
  ifr.ifr_ifru.ifru_map.mem_start = 0;
  ifr.ifr_ifru.ifru_map.mem_end = 0;
  ifr.ifr_ifrn._0_8_ = 0;
  ifr.ifr_ifrn._8_8_ = 0;
  ifr.ifr_ifru._16_8_ = 0;
  src = os_if->name;
  strscpy((char *)&ifr,src,0x10);
  iVar3 = os_system_linux_linux_get_ioctl_fd(2);
  iVar7 = 0;
  iVar3 = ioctl(iVar3,0x8913,&ifr);
  oVar2 = _oonf_os_interface_subsystem.logging;
  if (iVar3 < 0) {
    iVar7 = -1;
    if ((log_global_mask[_oonf_os_interface_subsystem.logging] & 4) != 0) {
      puVar4 = (uint *)__errno_location();
      pcVar8 = strerror(*puVar4);
      oonf_log(LOG_SEVERITY_WARN,oVar2,"src/base/os_linux/os_interface_linux.c",0x197,(void *)0x0,0,
               "ioctl SIOCGIFFLAGS (get flags) error on device %s: %s (%d)\n",src,pcVar8,
               (ulong)*puVar4);
    }
  }
  else {
    uVar1 = (ushort)ifr.ifr_ifru.ifru_map.mem_start;
    uVar6 = (ushort)up | uVar1 & 0xfffe;
    ifr.ifr_ifru.ifru_addr.sa_family = uVar6;
    if (uVar1 != uVar6) {
      iVar3 = os_system_linux_linux_get_ioctl_fd(2);
      iVar7 = 0;
      iVar3 = ioctl(iVar3,0x8914,&ifr);
      oVar2 = _oonf_os_interface_subsystem.logging;
      if (iVar3 < 0) {
        iVar7 = -1;
        if ((log_global_mask[_oonf_os_interface_subsystem.logging] & 4) != 0) {
          pcVar8 = "down";
          if (up) {
            pcVar8 = "up";
          }
          puVar4 = (uint *)__errno_location();
          pcVar5 = strerror(*puVar4);
          oonf_log(LOG_SEVERITY_WARN,oVar2,"src/base/os_linux/os_interface_linux.c",0x1aa,
                   (void *)0x0,0,"ioctl SIOCSIFFLAGS (set flags %s) error on device %s: %s (%d)\n",
                   pcVar8,src,pcVar5,(ulong)*puVar4);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int
os_interface_linux_state_set(struct os_interface *os_if, bool up) {
  int oldflags;
  struct ifreq ifr;

  memset(&ifr, 0, sizeof(ifr));
  strscpy(ifr.ifr_name, os_if->name, IF_NAMESIZE);

  if (ioctl(os_system_linux_linux_get_ioctl_fd(AF_INET), SIOCGIFFLAGS, &ifr) < 0) {
    OONF_WARN(LOG_OS_INTERFACE, "ioctl SIOCGIFFLAGS (get flags) error on device %s: %s (%d)\n", os_if->name,
      strerror(errno), errno);
    return -1;
  }

  oldflags = ifr.ifr_flags;
  if (up) {
    ifr.ifr_flags |= IFF_UP;
  }
  else {
    ifr.ifr_flags &= ~IFF_UP;
  }

  if (oldflags == ifr.ifr_flags) {
    /* interface is already up/down */
    return 0;
  }

  if (ioctl(os_system_linux_linux_get_ioctl_fd(AF_INET), SIOCSIFFLAGS, &ifr) < 0) {
    OONF_WARN(LOG_OS_INTERFACE, "ioctl SIOCSIFFLAGS (set flags %s) error on device %s: %s (%d)\n", up ? "up" : "down",
      os_if->name, strerror(errno), errno);
    return -1;
  }
  return 0;
}